

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O1

SparseArraySegmentBase * __thiscall
Js::JavascriptArray::GetBeginLookupSegment(JavascriptArray *this,uint32 index,bool useSegmentMap)

{
  Type TVar1;
  bool bVar2;
  DynamicObjectFlags DVar3;
  SegmentBTreeRoot *this_00;
  SparseArraySegmentBase *pSVar4;
  Type *pTVar5;
  SparseArraySegmentBase *local_30;
  SparseArraySegmentBase *matchOrNextSeg;
  SparseArraySegmentBase *seg;
  
  matchOrNextSeg = (SparseArraySegmentBase *)0x0;
  DVar3 = DynamicObject::GetArrayFlags((DynamicObject *)this);
  pTVar5 = (Type *)((long)this->segmentUnion + 0x20);
  if ((DVar3 & HasSegmentMap) == None) {
    pTVar5 = &this->segmentUnion;
  }
  TVar1 = *pTVar5;
  if (((TVar1 != (Type)0x0) && (*(uint *)TVar1 <= index)) &&
     (matchOrNextSeg = (SparseArraySegmentBase *)TVar1,
     index - *(uint *)TVar1 < *(Type *)((long)TVar1 + 8))) {
    return (SparseArraySegmentBase *)TVar1;
  }
  this_00 = GetSegmentMap(this);
  if (this_00 == (SegmentBTreeRoot *)0x0 || !useSegmentMap) {
    if (matchOrNextSeg != (SparseArraySegmentBase *)0x0) {
      return matchOrNextSeg;
    }
    return (this->head).ptr;
  }
  if (matchOrNextSeg == (SparseArraySegmentBase *)0x0) goto LAB_00b80244;
  pSVar4 = (matchOrNextSeg->next).ptr;
  if (pSVar4 == (SparseArraySegmentBase *)0x0) {
LAB_00b8023e:
    bVar2 = true;
    pSVar4 = matchOrNextSeg;
  }
  else if (index < pSVar4->left) {
    bVar2 = false;
    pSVar4 = matchOrNextSeg;
  }
  else {
    if (pSVar4->size <= index - pSVar4->left) goto LAB_00b8023e;
    bVar2 = false;
  }
  if (!bVar2) {
    return pSVar4;
  }
LAB_00b80244:
  SegmentBTreeRoot::Find(this_00,index,&matchOrNextSeg,&local_30);
  if (matchOrNextSeg == (SparseArraySegmentBase *)0x0) {
    matchOrNextSeg = local_30;
  }
  return matchOrNextSeg;
}

Assistant:

SparseArraySegmentBase * JavascriptArray::GetBeginLookupSegment(uint32 index, const bool useSegmentMap) const
    {
        SparseArraySegmentBase *seg = nullptr;
        SparseArraySegmentBase * lastUsedSeg = this->GetLastUsedSegment();
        if (lastUsedSeg != nullptr && lastUsedSeg->left <= index)
        {
            seg = lastUsedSeg;
            if(index - lastUsedSeg->left < lastUsedSeg->size)
            {
                return seg;
            }
        }

        SegmentBTreeRoot * segmentMap = GetSegmentMap();
        if(!useSegmentMap || !segmentMap)
        {
            return seg ? seg : PointerValue(this->head);
        }

        if(seg)
        {
            // If indexes are being accessed sequentially, check the segment after the last-used segment before checking the
            // segment map, as it is likely to hit
            SparseArraySegmentBase *const nextSeg = seg->next;
            if(nextSeg)
            {
                if(index < nextSeg->left)
                {
                    return seg;
                }
                else if(index - nextSeg->left < nextSeg->size)
                {
                    return nextSeg;
                }
            }
        }

        SparseArraySegmentBase *matchOrNextSeg;
        segmentMap->Find(index, seg, matchOrNextSeg);
        return seg ? seg : matchOrNextSeg;
    }